

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O0

void __thiscall
TemporalPhaseDecodingSynapse::initialize
          (TemporalPhaseDecodingSynapse *this,Population *n_from,Population *n_to)

{
  int iVar1;
  ostream *this_00;
  undefined8 *puVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  long *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int i;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff98;
  value_type *__x;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffffa0;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffffb0;
  Scalar *in_stack_ffffffffffffffb8;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffc0;
  int local_34;
  
  iVar1 = (**(code **)(*in_RSI + 8))();
  in_RDI[0xc] = iVar1;
  iVar1 = (**(code **)(*in_RDX + 8))();
  in_RDI[0xd] = iVar1;
  if (in_RDI[0xc] != in_RDI[0xd]) {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Number of input neurons not equal to number of output neurons");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  *(long **)(in_RDI + 2) = in_RSI;
  *(long **)(in_RDI + 4) = in_RDX;
  pCVar3 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x14) = pCVar3;
  pLVar4 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x16) = pLVar4;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(in_stack_ffffffffffffffb0,in_RDI);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1707b7);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(double *)(in_RDI + 0xe) =
       *(double *)(*(long *)(in_RDI + 6) + 0x10) + *(double *)(*(long *)(in_RDI + 6) + 0x18);
  *(double *)(in_RDI + 0x10) =
       *(double *)(*(long *)(in_RDI + 6) + 0x10) / (double)**(int **)(in_RDI + 6);
  *(double *)(in_RDI + 0x12) =
       (*(double *)(*(long *)(in_RDI + 6) + 8) * 1.0) /
       ((double)**(int **)(in_RDI + 6) * 6.283185307179586);
  for (local_34 = 0; local_34 < in_RDI[0xc]; local_34 = local_34 + 1) {
    __x = (value_type *)(in_RDI + 0x18);
    this_01 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)operator_new(0x18);
    NoEvent::NoEvent((NoEvent *)in_stack_ffffffffffffffc0);
    std::vector<Event_*,_std::allocator<Event_*>_>::push_back
              ((vector<Event_*,_std::allocator<Event_*>_> *)this_01,__x);
    in_stack_ffffffffffffffc0 = this_01;
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    spikeTimes = Eigen::VectorXd(inputSize);
    spikeTimes.setConstant(-1);
    currentWindow = param->window_length_s + param->delay_s;
    phaseStep = param->window_length_s / param->som_frequency;
    phaseOffset = (param->som_phase * 1.0) / (2 * M_PI * param->som_frequency);
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new NoEvent());
    }
}